

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O2

int __thiscall
flow_cutter::PierceNodeScore::operator()
          (PierceNodeScore *this,int x,int side,bool causes_augmenting_path,int source_dist,
          int target_dist,int cutter_id)

{
  uint uVar1;
  anon_class_24_3_0fdba398 random_number;
  int local_30;
  int local_2c;
  anon_class_24_3_0fdba398 local_28;
  
  local_28.x = &local_2c;
  local_28.side = &local_30;
  local_30 = side;
  local_2c = x;
  local_28.this = this;
  switch((this->config).pierce_rating) {
  case max_target_minus_source_hop_dist:
    target_dist = target_dist - source_dist;
    break;
  case min_source_hop_dist:
    target_dist = -source_dist;
    break;
  case max_target_hop_dist:
    break;
  case random:
    target_dist = operator()::anon_class_24_3_0fdba398::operator()(&local_28);
    break;
  default:
    target_dist = 0;
  }
  uVar1 = target_dist;
  switch((this->config).avoid_augmenting_path) {
  case avoid_and_pick_best:
    uVar1 = target_dist + 0xc4653600;
    if (!causes_augmenting_path) {
      uVar1 = target_dist;
    }
    break;
  case do_not_avoid:
    break;
  case avoid_and_pick_oldest:
    if (causes_augmenting_path) {
      uVar1 = 0xc4653600;
    }
    break;
  case avoid_and_pick_random:
    if (causes_augmenting_path) {
      uVar1 = operator()::anon_class_24_3_0fdba398::operator()(&local_28);
      uVar1 = uVar1 + 0xc4653600;
    }
    break;
  default:
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

int operator()(int x, int side, bool causes_augmenting_path, int source_dist,
        int target_dist, int cutter_id) const
    {

        auto random_number = [&] {
            if (side == BasicCutter::source_side)
                return (hash_factor * (unsigned)(x << 1) + hash_offset) % hash_modulo;
            else
                return (hash_factor * ((unsigned)(x << 1) + 1) + hash_offset) % hash_modulo;
        };

        int score;
        switch (config.pierce_rating) {
        case Config::PierceRating::max_target_minus_source_hop_dist:
            score = target_dist - source_dist;
            break;
        case Config::PierceRating::max_target_hop_dist:
            score = target_dist;
            break;
        case Config::PierceRating::min_source_hop_dist:
            score = -source_dist;
            break;
        case Config::PierceRating::oldest:
            score = 0;
            break;
        case Config::PierceRating::random:
            score = random_number();
            break;

        default:
            assert(false);
            score = 0;
        }
        switch (config.avoid_augmenting_path) {
        case Config::AvoidAugmentingPath::avoid_and_pick_best:
            if (causes_augmenting_path)
                score -= 1000000000;
            break;
        case Config::AvoidAugmentingPath::do_not_avoid:
            break;
        case Config::AvoidAugmentingPath::avoid_and_pick_oldest:
            if (causes_augmenting_path)
                score = -1000000000;
            break;
        case Config::AvoidAugmentingPath::avoid_and_pick_random:
            if (causes_augmenting_path)
                score = random_number() - 1000000000;
            break;
        default:
            assert(false);
            score = 0;
        }
        return score;
    }